

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lzma2Dec.c
# Opt level: O2

SRes Lzma2Dec_GetOldProps(Byte prop,Byte *props)

{
  int iVar1;
  
  if (0x28 < prop) {
    return 4;
  }
  if (prop == '(') {
    iVar1 = -1;
  }
  else {
    iVar1 = (prop & 1 | 2) << ((prop >> 1) + 0xb & 0x1f);
  }
  *props = '\x04';
  props[1] = (Byte)iVar1;
  props[2] = (Byte)((uint)iVar1 >> 8);
  props[3] = (Byte)((uint)iVar1 >> 0x10);
  props[4] = (Byte)((uint)iVar1 >> 0x18);
  return 0;
}

Assistant:

static SRes Lzma2Dec_GetOldProps(Byte prop, Byte *props)
{
  UInt32 dicSize;
  if (prop > 40)
    return SZ_ERROR_UNSUPPORTED;
  dicSize = (prop == 40) ? 0xFFFFFFFF : LZMA2_DIC_SIZE_FROM_PROP(prop);
  props[0] = (Byte)LZMA2_LCLP_MAX;
  props[1] = (Byte)(dicSize);
  props[2] = (Byte)(dicSize >> 8);
  props[3] = (Byte)(dicSize >> 16);
  props[4] = (Byte)(dicSize >> 24);
  return SZ_OK;
}